

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O1

int ChebTools::get_decreasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
              (Matrix<double,__1,_1,_0,__1,_1> *breakpoints,double x,int N)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = 0;
  if (2 < N) {
    iVar3 = N + -1;
    uVar1 = 0;
    do {
      if (((int)((ulong)((long)(int)uVar1 + (long)iVar3) >> 1) < 0) ||
         (uVar2 = (long)(int)uVar1 + (long)iVar3 >> 1,
         (breakpoints->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
         m_rows <= (long)uVar2)) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      if ((breakpoints->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[uVar2] < x) {
        iVar3 = (int)uVar2;
        uVar2 = (ulong)uVar1;
      }
      uVar1 = (uint)uVar2;
    } while (1 < (int)(iVar3 - uVar1));
  }
  return uVar1;
}

Assistant:

int get_decreasingleftofval(const VecType& breakpoints, double x, int N) {
        int iL = 0, iR = N - 1, iM;
        while (iR - iL > 1) {
            iM = midpoint_Knuth(iL, iR);
            if (x <= breakpoints[iM]) {
                iL = iM;
            }
            else {
                iR = iM;
            }
        }
        return iL;
    }